

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall QAbstractSpinBox::keyPressEvent(QAbstractSpinBox *this,QKeyEvent *event)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Int IVar8;
  int iVar9;
  QAbstractSpinBoxPrivate *pQVar10;
  qsizetype qVar11;
  QStyle *pQVar12;
  qsizetype qVar13;
  long lVar14;
  QLineEdit *this_00;
  socklen_t *psVar15;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *psVar16;
  sockaddr *__addr_00;
  QKeyEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int currentPos;
  bool up;
  bool isPgUpOrDown;
  int steps;
  QAbstractSpinBoxPrivate *d;
  QString text;
  QAccessibleValueChangeEvent event_1;
  undefined4 in_stack_fffffffffffffe78;
  StepEnabledFlag in_stack_fffffffffffffe7c;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  QObject *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  QLineEdit *in_stack_fffffffffffffe98;
  QAbstractSpinBox *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  undefined2 uVar17;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  bool local_137;
  int local_108;
  int local_fc;
  QString local_c8;
  undefined4 local_b0;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_ac;
  QLatin1StringView local_a8 [2];
  undefined4 local_80;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_7c;
  undefined4 local_78;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_74;
  undefined4 local_70;
  QFlagsStorageHelper<QAbstractSpinBox::StepEnabledFlag,_4> local_6c [8];
  Int local_4c;
  QAccessibleValueChangeEvent local_48 [64];
  long local_8;
  
  uVar17 = (undefined2)((ulong)in_stack_fffffffffffffea8 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = d_func((QAbstractSpinBox *)0x68853e);
  local_4c = QKeyEvent::modifiers();
  (pQVar10->keyboardModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i = local_4c;
  iVar7 = (int)in_RSI;
  QKeyEvent::text((QKeyEvent *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  bVar1 = QString::isEmpty((QString *)0x688591);
  bVar3 = false;
  if (!bVar1) {
    iVar5 = QLineEdit::cursorPosition
                      ((QLineEdit *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    qVar11 = QString::size(&pQVar10->prefix);
    bVar3 = iVar5 < qVar11;
  }
  QString::~QString((QString *)0x6885f4);
  if (bVar3) {
    qVar11 = QString::size(&pQVar10->prefix);
    iVar7 = (int)qVar11;
    QLineEdit::setCursorPosition
              ((QLineEdit *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe7c);
  }
  local_fc = 1;
  bVar3 = false;
  uVar6 = QKeyEvent::key(in_RSI);
  psVar15 = (socklen_t *)(ulong)uVar6;
  if (uVar6 == 0x55) {
    local_80 = QKeyEvent::modifiers();
    iVar7 = 0x4000000;
    local_7c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&
                   ((QFlags<Qt::KeyboardModifier> *)
                    CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                    in_stack_fffffffffffffe7c);
    IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_7c);
    psVar15 = (socklen_t *)(ulong)IVar8;
    local_137 = false;
    psVar16 = extraout_RDX;
    if (IVar8 != 0) {
      QGuiApplication::platformName();
      local_a8[0] = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffffe88,
                               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      iVar7 = (int)local_a8;
      local_137 = ::operator==((QString *)in_stack_fffffffffffffe88,
                               (QLatin1StringView *)
                               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      QString::~QString((QString *)0x688aa8);
      psVar16 = extraout_RDX_00;
    }
    if (local_137 != false) {
      QEvent::accept((QEvent *)in_RSI,iVar7,psVar16,psVar15);
      bVar3 = isReadOnly((QAbstractSpinBox *)
                         CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      if (!bVar3) {
        (**(code **)(*in_RDI + 0x1b8))();
      }
      goto LAB_00688e73;
    }
  }
  else {
    if (uVar6 + 0xfefffffc < 2) {
      QLineEdit::d_func((QLineEdit *)0x688961);
      QWidgetLineControl::clearUndo
                ((QWidgetLineControl *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80)
                );
      (**(code **)(*(long *)&pQVar10->super_QWidgetPrivate + 0xd0))
                (pQVar10,(*(ushort *)&pQVar10->field_0x3d0 >> 6 & 1) != 0);
      selectAll(in_stack_fffffffffffffea0);
      QEvent::ignore((QEvent *)in_RSI);
      editingFinished((QAbstractSpinBox *)0x6889c6);
      returnPressed((QAbstractSpinBox *)0x6889d0);
      QLineEdit::returnPressed((QLineEdit *)0x6889e4);
      goto LAB_00688e73;
    }
    if (1 < uVar6 + 0xfefffff0) {
      if ((uVar6 != 0x1000013) && (uVar6 != 0x1000015)) {
        if (uVar6 != 0x1000016 && uVar6 != 0x1000017) {
          iVar7 = 0x1a;
          bVar3 = ::operator==((QKeyEvent *)
                               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                               in_stack_fffffffffffffe7c);
          if (bVar3) {
            selectAll(in_stack_fffffffffffffea0);
            QEvent::accept((QEvent *)in_RSI,iVar7,__addr_00,psVar15);
            goto LAB_00688e73;
          }
          goto LAB_00688dc3;
        }
        local_fc = 10;
        bVar3 = true;
      }
      QEvent::accept((QEvent *)in_RSI,iVar7,__addr,psVar15);
      iVar7 = QKeyEvent::key(in_RSI);
      bVar1 = true;
      if (iVar7 != 0x1000016) {
        iVar7 = QKeyEvent::key(in_RSI);
        bVar1 = iVar7 == 0x1000013;
      }
      local_70 = (**(code **)(*in_RDI + 0x1c8))();
      local_6c[0].super_QFlagsStorage<QAbstractSpinBox::StepEnabledFlag>.i =
           (QFlagsStorage<QAbstractSpinBox::StepEnabledFlag>)
           QFlags<QAbstractSpinBox::StepEnabledFlag>::operator&
                     ((QFlags<QAbstractSpinBox::StepEnabledFlag> *)
                      CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                      in_stack_fffffffffffffe7c);
      bVar2 = QFlags<QAbstractSpinBox::StepEnabledFlag>::operator!
                        ((QFlags<QAbstractSpinBox::StepEnabledFlag> *)local_6c);
      if (!bVar2) {
        bVar2 = false;
        if (!bVar3) {
          local_78 = QKeyEvent::modifiers();
          local_74.super_QFlagsStorage<Qt::KeyboardModifier>.i =
               (QFlagsStorage<Qt::KeyboardModifier>)
               QFlags<Qt::KeyboardModifier>::operator&
                         ((QFlags<Qt::KeyboardModifier> *)
                          CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                          in_stack_fffffffffffffe7c);
          IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_74);
          bVar2 = IVar8 != 0;
        }
        if (bVar2) {
          local_fc = local_fc * 10;
        }
        if (!bVar1) {
          local_fc = -local_fc;
        }
        pQVar12 = QWidget::style((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        iVar7 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,0x2a,0,in_RDI);
        if (iVar7 != 0) {
          uVar6 = 0x20;
          if (bVar1) {
            uVar6 = 0x10;
          }
          pQVar10->buttonState = uVar6 | 1;
        }
        bVar1 = QBasicTimer::isActive(&pQVar10->spinClickTimer);
        if (!bVar1) {
          (**(code **)(*in_RDI + 0x1b0))(in_RDI,local_fc);
        }
        bVar1 = QKeyEvent::isAutoRepeat(in_RSI);
        if ((((bVar1) && (!bVar3)) &&
            (bVar3 = QBasicTimer::isActive(&pQVar10->spinClickThresholdTimer), !bVar3)) &&
           (bVar3 = QBasicTimer::isActive(&pQVar10->spinClickTimer), !bVar3)) {
          QAbstractSpinBoxPrivate::updateState
                    ((QAbstractSpinBoxPrivate *)
                     CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     SUB21((ushort)uVar17 >> 8,0),SUB21(uVar17,0));
        }
        memset(local_48,0xaa,0x40);
        QAccessibleValueChangeEvent::QAccessibleValueChangeEvent
                  ((QAccessibleValueChangeEvent *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   in_stack_fffffffffffffe88,
                   (QVariant *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
        QAccessible::updateAccessibility((QAccessibleEvent *)local_48);
        QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent(local_48);
      }
      goto LAB_00688e73;
    }
    local_b0 = QKeyEvent::modifiers();
    local_ac.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&
                   ((QFlags<Qt::KeyboardModifier> *)
                    CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                    in_stack_fffffffffffffe7c);
    IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_ac);
    if (IVar8 == 0) goto LAB_00688dc3;
    iVar5 = QLineEdit::cursorPosition
                      ((QLineEdit *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QLineEdit::displayText((QLineEdit *)in_stack_fffffffffffffe88);
    iVar9 = QKeyEvent::key(in_RSI);
    iVar7 = iVar5;
    if (iVar9 == 0x1000011) {
      if ((iVar5 != 0) || (bVar3 = QString::isEmpty((QString *)0x688bc2), bVar3)) {
        qVar11 = QString::size(&local_c8);
        qVar13 = QString::size(&pQVar10->suffix);
        if ((long)iVar5 < qVar11 - qVar13) {
          QString::size(&local_c8);
          QString::size(&pQVar10->suffix);
          psVar15 = (socklen_t *)(long)iVar5;
          QLineEdit::setSelection
                    (in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
          psVar16 = extraout_RDX_01;
LAB_00688d52:
          QEvent::accept((QEvent *)in_RSI,iVar7,psVar16,psVar15);
          local_108 = 1;
          goto LAB_00688d6a;
        }
      }
      local_108 = 2;
    }
    else {
      lVar14 = (long)iVar5;
      qVar11 = QString::size(&local_c8);
      if ((lVar14 != qVar11) || (bVar3 = QString::isEmpty((QString *)0x688cc1), bVar3)) {
        this_00 = (QLineEdit *)(long)iVar5;
        qVar11 = QString::size(&pQVar10->prefix);
        if (qVar11 < (long)this_00) {
          in_stack_fffffffffffffe88 = (QObject *)pQVar10->edit;
          QString::size(&pQVar10->prefix);
          psVar15 = (socklen_t *)(long)iVar5;
          QLineEdit::setSelection(this_00,iVar7,in_stack_fffffffffffffe90);
          psVar16 = extraout_RDX_02;
          goto LAB_00688d52;
        }
      }
      local_108 = 2;
    }
LAB_00688d6a:
    QString::~QString((QString *)0x688d77);
    if (local_108 == 1) goto LAB_00688e73;
  }
LAB_00688dc3:
  (**(code **)(*(long *)&pQVar10->edit->super_QWidget + 0x28))(pQVar10->edit,in_RSI);
  QLineEdit::text((QLineEdit *)in_stack_fffffffffffffe88);
  bVar3 = QString::isEmpty((QString *)0x688e09);
  bVar4 = bVar3 ^ 0xff;
  QString::~QString((QString *)0x688e1c);
  if ((bVar4 & 1) != 0) {
    *(ushort *)&pQVar10->field_0x3d0 = *(ushort *)&pQVar10->field_0x3d0 & 0xff7f;
  }
  bVar3 = QWidget::isVisible((QWidget *)0x688e4f);
  if (!bVar3) {
    *(ushort *)&pQVar10->field_0x3d0 = *(ushort *)&pQVar10->field_0x3d0 & 0xfeff | 0x100;
  }
LAB_00688e73:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractSpinBox::keyPressEvent(QKeyEvent *event)
{
    Q_D(QAbstractSpinBox);

    d->keyboardModifiers = event->modifiers();

    if (!event->text().isEmpty() && d->edit->cursorPosition() < d->prefix.size())
        d->edit->setCursorPosition(d->prefix.size());

    int steps = 1;
    bool isPgUpOrDown = false;
    switch (event->key()) {
    case Qt::Key_PageUp:
    case Qt::Key_PageDown:
        steps *= 10;
        isPgUpOrDown = true;
        Q_FALLTHROUGH();
    case Qt::Key_Up:
    case Qt::Key_Down: {
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            // Reserve up/down for nav - use left/right for edit.
            if (!hasEditFocus() && (event->key() == Qt::Key_Up
                                    || event->key() == Qt::Key_Down)) {
                event->ignore();
                return;
            }
        }
#endif
        event->accept();
        const bool up = (event->key() == Qt::Key_PageUp || event->key() == Qt::Key_Up);
        if (!(stepEnabled() & (up ? StepUpEnabled : StepDownEnabled)))
            return;
        if (!isPgUpOrDown && (event->modifiers() & d->stepModifier))
            steps *= 10;
        if (!up)
            steps *= -1;
        if (style()->styleHint(QStyle::SH_SpinBox_AnimateButton, nullptr, this)) {
            d->buttonState = (Keyboard | (up ? Up : Down));
        }
        if (!d->spinClickTimer.isActive())
            stepBy(steps);
        if (event->isAutoRepeat() && !isPgUpOrDown) {
            if (!d->spinClickThresholdTimer.isActive() && !d->spinClickTimer.isActive()) {
                d->updateState(up, true);
            }
        }
#if QT_CONFIG(accessibility)
        QAccessibleValueChangeEvent event(this, d->value);
        QAccessible::updateAccessibility(&event);
#endif
        return;
    }
#ifdef QT_KEYPAD_NAVIGATION
    case Qt::Key_Left:
    case Qt::Key_Right:
        if (QApplicationPrivate::keypadNavigationEnabled() && !hasEditFocus()) {
            event->ignore();
            return;
        }
        break;
    case Qt::Key_Back:
        if (QApplicationPrivate::keypadNavigationEnabled() && !hasEditFocus()) {
            event->ignore();
            return;
        }
        break;
#endif
    case Qt::Key_Enter:
    case Qt::Key_Return:
        d->edit->d_func()->control->clearUndo();
        d->interpret(d->keyboardTracking ? AlwaysEmit : EmitIfChanged);
        selectAll();
        event->ignore();
        emit editingFinished();
        emit returnPressed();
        emit d->edit->returnPressed();
        return;

#ifdef QT_KEYPAD_NAVIGATION
    case Qt::Key_Select:
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            // Toggles between left/right moving cursor and inc/dec.
            setEditFocus(!hasEditFocus());
        }
        return;
#endif

    case Qt::Key_U:
        if (event->modifiers() & Qt::ControlModifier
            && QGuiApplication::platformName() == "xcb"_L1) { // only X11
            event->accept();
            if (!isReadOnly())
                clear();
            return;
        }
        break;

    case Qt::Key_End:
    case Qt::Key_Home:
        if (event->modifiers() & Qt::ShiftModifier) {
            int currentPos = d->edit->cursorPosition();
            const QString text = d->edit->displayText();
            if (event->key() == Qt::Key_End) {
                if ((currentPos == 0 && !d->prefix.isEmpty()) || text.size() - d->suffix.size() <= currentPos) {
                    break; // let lineedit handle this
                } else {
                    d->edit->setSelection(currentPos, text.size() - d->suffix.size() - currentPos);
                }
            } else {
                if ((currentPos == text.size() && !d->suffix.isEmpty()) || currentPos <= d->prefix.size()) {
                    break; // let lineedit handle this
                } else {
                    d->edit->setSelection(currentPos, d->prefix.size() - currentPos);
                }
            }
            event->accept();
            return;
        }
        break;

    default:
#ifndef QT_NO_SHORTCUT
        if (event == QKeySequence::SelectAll) {
            selectAll();
            event->accept();
            return;
        }
#endif
        break;
    }

    d->edit->event(event);
    if (!d->edit->text().isEmpty())
        d->cleared = false;
    if (!isVisible())
        d->ignoreUpdateEdit = true;
}